

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O1

void __thiscall Imf_2_5::ScanLineInputFile::initialize(ScanLineInputFile *this,Header *header)

{
  int iVar1;
  int iVar2;
  Format FVar3;
  int iVar4;
  LineOrder *pLVar5;
  Box2i *pBVar6;
  size_t maxScanLineSize;
  LineBuffer *pLVar7;
  Compression *pCVar8;
  Compressor *compressor;
  pointer ppLVar9;
  Data *pDVar10;
  InputExc *this_00;
  ulong uVar11;
  char *local_40;
  Box2i *local_38;
  
  Header::operator=(&this->_data->header,header);
  pLVar5 = Header::lineOrder(&this->_data->header);
  pDVar10 = this->_data;
  pDVar10->lineOrder = *pLVar5;
  pBVar6 = Header::dataWindow(&pDVar10->header);
  pDVar10 = this->_data;
  iVar4 = (pBVar6->min).y;
  iVar1 = (pBVar6->max).x;
  iVar2 = (pBVar6->max).y;
  pDVar10->minX = (pBVar6->min).x;
  pDVar10->maxX = iVar1;
  pDVar10->minY = iVar4;
  pDVar10->maxY = iVar2;
  maxScanLineSize = bytesPerLineTable(&pDVar10->header,&pDVar10->bytesPerLine);
  if (maxScanLineSize < 0x80000000) {
    pDVar10 = this->_data;
    ppLVar9 = (pDVar10->lineBuffers).
              super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_38 = pBVar6;
    if ((pDVar10->lineBuffers).
        super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppLVar9) {
      uVar11 = 0;
      do {
        pLVar7 = (LineBuffer *)operator_new(0x80);
        pCVar8 = Header::compression(&pDVar10->header);
        compressor = newCompressor(*pCVar8,maxScanLineSize,&this->_data->header);
        (pLVar7->buffer)._size = 0;
        (pLVar7->buffer)._data = (char *)0x0;
        *(undefined4 *)&pLVar7->dataPtr = 0;
        pLVar7->endOfLineBufferData = (char *)compressor;
        FVar3 = defaultFormat(compressor);
        pLVar7->minY = FVar3;
        pLVar7->maxY = -1;
        *(undefined1 *)&pLVar7->scanLineMin = 0;
        pLVar7->compressor = (Compressor *)&pLVar7->exception;
        pLVar7->partiallyFull = false;
        pLVar7->hasException = false;
        *(undefined6 *)&pLVar7->field_0x42 = 0;
        *(undefined1 *)&(pLVar7->exception)._M_dataplus._M_p = 0;
        IlmThread_2_5::Semaphore::Semaphore((Semaphore *)(pLVar7->exception).field_2._M_local_buf,1)
        ;
        (this->_data->lineBuffers).
        super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar11] = pLVar7;
        uVar11 = uVar11 + 1;
        pDVar10 = this->_data;
        ppLVar9 = (pDVar10->lineBuffers).
                  super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar11 < (ulong)((long)(pDVar10->lineBuffers).
                                      super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar9 >>
                               3));
    }
    iVar4 = numLinesInBuffer((Compressor *)(*ppLVar9)->endOfLineBufferData);
    pDVar10 = this->_data;
    pDVar10->linesInBuffer = iVar4;
    pDVar10->lineBufferSize = maxScanLineSize * (long)iVar4;
    iVar4 = (*this->_streamData->is->_vptr_IStream[2])();
    if (((char)iVar4 == '\0') &&
       (pDVar10 = this->_data,
       (pDVar10->lineBuffers).
       super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
       ._M_impl.super__Vector_impl_data._M_finish !=
       (pDVar10->lineBuffers).
       super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
       ._M_impl.super__Vector_impl_data._M_start)) {
      uVar11 = 0;
      do {
        local_40 = (char *)0x0;
        iVar4 = posix_memalign(&local_40,0x10,pDVar10->lineBufferSize);
        if (iVar4 != 0) {
          local_40 = (char *)0x0;
        }
        ((this->_data->lineBuffers).
         super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar11]->buffer)._data = local_40;
        uVar11 = uVar11 + 1;
        pDVar10 = this->_data;
      } while (uVar11 < (ulong)((long)(pDVar10->lineBuffers).
                                      super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pDVar10->lineBuffers).
                                      super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    pDVar10 = this->_data;
    pDVar10->nextLineBufferMinY = pDVar10->minY + -1;
    offsetInLineBufferTable
              (&pDVar10->bytesPerLine,pDVar10->linesInBuffer,&pDVar10->offsetInLineBuffer);
    iVar4 = this->_data->linesInBuffer;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&this->_data->lineOffsets,
               (long)((((local_38->max).y - (local_38->min).y) + iVar4) / iVar4));
    return;
  }
  this_00 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::InputExc::InputExc(this_00,"maximum bytes per scanline exceeds maximum permissible size")
  ;
  __cxa_throw(this_00,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
}

Assistant:

void ScanLineInputFile::initialize(const Header& header)
{
        _data->header = header;

        _data->lineOrder = _data->header.lineOrder();

        const Box2i &dataWindow = _data->header.dataWindow();

        _data->minX = dataWindow.min.x;
        _data->maxX = dataWindow.max.x;
        _data->minY = dataWindow.min.y;
        _data->maxY = dataWindow.max.y;

        size_t maxBytesPerLine = bytesPerLineTable (_data->header,
                                                    _data->bytesPerLine);
        
        if(maxBytesPerLine > INT_MAX)
        {
            throw IEX_NAMESPACE::InputExc("maximum bytes per scanline exceeds maximum permissible size");
        }


        for (size_t i = 0; i < _data->lineBuffers.size(); i++)
        {
            _data->lineBuffers[i] = new LineBuffer (newCompressor
                                                (_data->header.compression(),
                                                 maxBytesPerLine,
                                                 _data->header));
        }

        _data->linesInBuffer =
            numLinesInBuffer (_data->lineBuffers[0]->compressor);

        _data->lineBufferSize = maxBytesPerLine * _data->linesInBuffer;

        if (!_streamData->is->isMemoryMapped())
        {
            for (size_t i = 0; i < _data->lineBuffers.size(); i++)
            {
                _data->lineBuffers[i]->buffer = (char *) EXRAllocAligned(_data->lineBufferSize*sizeof(char),16);
            }
        }
        _data->nextLineBufferMinY = _data->minY - 1;

        offsetInLineBufferTable (_data->bytesPerLine,
                                 _data->linesInBuffer,
                                 _data->offsetInLineBuffer);

        int lineOffsetSize = (dataWindow.max.y - dataWindow.min.y +
                              _data->linesInBuffer) / _data->linesInBuffer;

        _data->lineOffsets.resize (lineOffsetSize);
}